

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

void u_setDataDirectory_63(char *directory)

{
  size_t sVar1;
  char *pcStack_18;
  int32_t length;
  char *newDataDir;
  char *directory_local;
  
  if ((directory == (char *)0x0) || (*directory == '\0')) {
    pcStack_18 = "";
  }
  else {
    sVar1 = strlen(directory);
    pcStack_18 = (char *)uprv_malloc_63((long)((int)sVar1 + 2));
    if (pcStack_18 == (char *)0x0) {
      return;
    }
    strcpy(pcStack_18,directory);
  }
  if ((gDataDirectory != (char *)0x0) && (*gDataDirectory != '\0')) {
    uprv_free_63(gDataDirectory);
  }
  gDataDirectory = pcStack_18;
  ucln_common_registerCleanup_63(UCLN_COMMON_PUTIL,putil_cleanup);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_setDataDirectory(const char *directory) {
    char *newDataDir;
    int32_t length;

    if(directory==NULL || *directory==0) {
        /* A small optimization to prevent the malloc and copy when the
        shared library is used, and this is a way to make sure that NULL
        is never returned.
        */
        newDataDir = (char *)"";
    }
    else {
        length=(int32_t)uprv_strlen(directory);
        newDataDir = (char *)uprv_malloc(length + 2);
        /* Exit out if newDataDir could not be created. */
        if (newDataDir == NULL) {
            return;
        }
        uprv_strcpy(newDataDir, directory);

#if (U_FILE_SEP_CHAR != U_FILE_ALT_SEP_CHAR)
        {
            char *p;
            while((p = uprv_strchr(newDataDir, U_FILE_ALT_SEP_CHAR)) != NULL) {
                *p = U_FILE_SEP_CHAR;
            }
        }
#endif
    }

    if (gDataDirectory && *gDataDirectory) {
        uprv_free(gDataDirectory);
    }
    gDataDirectory = newDataDir;
    ucln_common_registerCleanup(UCLN_COMMON_PUTIL, putil_cleanup);
}